

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O2

void __thiscall duckdb_re2::BitState::Push(BitState *this,int id,char *p)

{
  int iVar1;
  Job *pJVar2;
  uint uVar3;
  ostream *poVar4;
  ostringstream local_190 [376];
  
  uVar3 = this->njob_;
  if ((int)(this->job_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
           .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
           super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter,_false> <=
      (int)uVar3) {
    GrowStack(this);
    uVar3 = this->njob_;
    if ((int)(this->job_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
             .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
             super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter,_false> <=
        (int)uVar3) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      poVar4 = std::operator<<((ostream *)local_190,"GrowStack() failed: ");
      poVar4 = std::operator<<(poVar4,"njob_ = ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->njob_);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"job_.size() = ");
      std::ostream::operator<<
                (poVar4,(int)(this->job_).ptr_._M_t.
                             super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
                             .super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
                             .
                             super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter,_false>
                );
      std::__cxx11::ostringstream::~ostringstream(local_190);
      return;
    }
  }
  if (0 < (int)uVar3 && -1 < id) {
    pJVar2 = (this->job_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Job_*,_false>._M_head_impl;
    if (pJVar2[(ulong)uVar3 - 1].id == id) {
      iVar1 = pJVar2[(ulong)uVar3 - 1].rle;
      if (((long)iVar1 != 0x7fffffff) && (pJVar2[(ulong)uVar3 - 1].p + (long)iVar1 + 1 == p)) {
        pJVar2[(ulong)uVar3 - 1].rle = iVar1 + 1;
        return;
      }
    }
  }
  this->njob_ = uVar3 + 1;
  pJVar2 = (this->job_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::Job,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb_re2::Job_*,_duckdb_re2::PODArray<duckdb_re2::Job>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::Job_*,_false>._M_head_impl;
  pJVar2[(int)uVar3].id = id;
  pJVar2[(int)uVar3].rle = 0;
  pJVar2[(int)uVar3].p = p;
  return;
}

Assistant:

void BitState::Push(int id, const char* p) {
  if (njob_ >= job_.size()) {
    GrowStack();
    if (njob_ >= job_.size()) {
      LOG(DFATAL) << "GrowStack() failed: "
                  << "njob_ = " << njob_ << ", "
                  << "job_.size() = " << job_.size();
      return;
    }
  }

  // If id < 0, it's undoing a Capture,
  // so we mustn't interfere with that.
  if (id >= 0 && njob_ > 0) {
    Job* top = &job_[njob_-1];
    if (id == top->id &&
        p == top->p + top->rle + 1 &&
        top->rle < std::numeric_limits<int>::max()) {
      ++top->rle;
      return;
    }
  }

  Job* top = &job_[njob_++];
  top->id = id;
  top->rle = 0;
  top->p = p;
}